

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<baryonyx::solver_parameters::floating_point_type,fmt::v7::formatter<baryonyx::solver_parameters::floating_point_type,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  iterator it;
  iterator iVar1;
  formatter<baryonyx::solver_parameters::floating_point_type,_char,_void> f;
  dynamic_format_specs<char> local_60;
  
  dynamic_format_specs<char>::dynamic_format_specs(&local_60);
  it = formatter<fmt::v7::basic_string_view<char>,char,void>::
       parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                 ((formatter<fmt::v7::basic_string_view<char>,char,void> *)&local_60,parse_ctx);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::advance_to(parse_ctx,it);
  iVar1 = formatter<baryonyx::solver_parameters::floating_point_type,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<baryonyx::solver_parameters::floating_point_type,char,void> *)
                     &local_60,*arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }